

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  uint uVar1;
  int iVar2;
  _Elt_pointer pBVar3;
  SharedDepEntry *dep;
  pointer piVar4;
  pointer pLVar5;
  cmGeneratorTarget *this_00;
  FILE *__stream;
  TargetType TVar6;
  string *psVar7;
  char *pcVar8;
  pointer piVar9;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar10;
  BFSEntry qe;
  int i;
  set<int,_std::less<int>,_std::allocator<int>_> emmitted;
  
  AddDirectLinkEntries(this);
  while (pBVar3 = (this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->BFSQueue).c.
        super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pBVar3) {
    uVar1 = pBVar3->Index;
    pcVar8 = pBVar3->LibDepends;
    std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
    pop_front(&(this->BFSQueue).c);
    qe._4_4_ = 0;
    qe.Index = uVar1;
    qe.LibDepends = pcVar8;
    FollowLinkEntry(this,qe);
  }
  while (dep = (this->SharedDepQueue).c.
               super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->SharedDepQueue).c.
        super__Deque_base<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != dep) {
    HandleSharedDependency(this,dep);
    std::
    deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
    ::pop_front(&(this->SharedDepQueue).c);
  }
  InferDependencies(this);
  CleanConstraintGraph(this);
  if (this->DebugMode == true) {
    fwrite("------------------------------------------------------------------------------\n",0x4f,1
           ,_stderr);
    __stream = _stderr;
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    if (this->HasConfig == false) {
      pcVar8 = "noconfig";
    }
    else {
      pcVar8 = (this->Config)._M_dataplus._M_p;
    }
    fprintf(__stream,"Link dependency analysis for target %s, config %s\n",
            (psVar7->_M_dataplus)._M_p,pcVar8);
    DisplayConstraintGraph(this);
  }
  OrderLinkEntires(this);
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emmitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar4 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (this->FinalLinkOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emmitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (piVar9 == piVar4) {
      std::
      __reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
                ((this->FinalLinkEntries).
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->FinalLinkEntries).
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if (this->DebugMode == true) {
        DisplayFinalEntries(this);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&emmitted._M_t);
      return &this->FinalLinkEntries;
    }
    iVar2 = piVar9[-1];
    pLVar5 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = pLVar5[iVar2].Target;
    i = iVar2;
    if (this_00 == (cmGeneratorTarget *)0x0) {
LAB_002fa1fd:
      std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
      ::push_back(&this->FinalLinkEntries,pLVar5 + iVar2);
    }
    else {
      TVar6 = cmGeneratorTarget::GetType(this_00);
      if (TVar6 != SHARED_LIBRARY) goto LAB_002fa1fd;
      pVar10 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
               _M_insert_unique<int_const&>
                         ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                           *)&emmitted,&i);
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_002fa1fd;
    }
    piVar9 = piVar9 + -1;
  } while( true );
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the final ordering.
  this->OrderLinkEntires();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emmitted;
  for (int i : cmReverseRange(this->FinalLinkOrder)) {
    LinkEntry const& e = this->EntryList[i];
    cmGeneratorTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmStateEnums::SHARED_LIBRARY;
    if (!uniquify || emmitted.insert(i).second) {
      this->FinalLinkEntries.push_back(e);
    }
  }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}